

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_9c70f::CheckVariableConflict
          (anon_unknown_dwarf_9c70f *this,ExpressionContext *ctx,SynBase *source,InplaceStr name)

{
  uint uVar1;
  TypeBase *pTVar2;
  IdentifierLookupResult *pIVar3;
  NamespaceData *pNVar4;
  ScopeData *end;
  ScopeData *pSVar5;
  char *msg;
  InplaceStr name_00;
  
  end = (ScopeData *)name.begin;
  pSVar5 = end;
  uVar1 = NULLC::GetStringHash((char *)source,(char *)end);
  pTVar2 = LookupTypeByName(*(anon_unknown_dwarf_9c70f **)(this + 0x8158),
                            *(ExpressionContext **)(this + 0x8160),uVar1);
  if (pTVar2 != (TypeBase *)0x0) {
    msg = "ERROR: name \'%.*s\' is already taken for a type";
    goto LAB_00166054;
  }
  uVar1 = NULLC::GetStringHash((char *)source,(char *)end);
  pIVar3 = LookupObjectByName((ExpressionContext *)this,uVar1);
  if (pIVar3 != (IdentifierLookupResult *)0x0) {
    pSVar5 = (ScopeData *)pIVar3->variable;
    if ((pSVar5 != (ScopeData *)0x0) &&
       (pSVar5 = (ScopeData *)pSVar5->ownerNamespace, pSVar5 == *(ScopeData **)(this + 0x8158))) {
      msg = "ERROR: name \'%.*s\' is already taken for a variable in current scope";
      goto LAB_00166054;
    }
    if ((pIVar3->function != (FunctionData *)0x0) &&
       (pIVar3->function->scope == *(ScopeData **)(this + 0x8158))) {
      msg = "ERROR: name \'%.*s\' is already taken for a function";
      goto LAB_00166054;
    }
  }
  name_00.end = (char *)pSVar5;
  name_00.begin = (char *)end;
  pNVar4 = FindNamespaceInCurrentScope(this,(ExpressionContext *)source,name_00);
  if (pNVar4 == (NamespaceData *)0x0) {
    return false;
  }
  msg = "ERROR: name \'%.*s\' is already taken for a namespace";
LAB_00166054:
  Report((ExpressionContext *)this,(SynBase *)ctx,msg,(ulong)(uint)((int)name.begin - (int)source),
         source);
  return true;
}

Assistant:

bool CheckVariableConflict(ExpressionContext &ctx, SynBase *source, InplaceStr name)
	{
		if(LookupTypeByName(ctx, name.hash()))
		{
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(name));
			return true;
		}

		if(IdentifierLookupResult *lookup = LookupObjectByName(ctx, name.hash()))
		{
			if(lookup->variable && lookup->variable->scope == ctx.scope)
			{
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name));
				return true;
			}

			if(lookup->function && lookup->function->scope == ctx.scope)
			{
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a function", FMT_ISTR(name));
				return true;
			}
		}

		if(FindNamespaceInCurrentScope(ctx, name))
		{
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a namespace", FMT_ISTR(name));
			return true;
		}

		return false;
	}